

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O1

void digest_(Spec_Hash_Definitions_hash_alg a,Hacl_Hash_SHA3_state_t *state,uint8_t *output,
            uint32_t l)

{
  uint64_t *__src;
  byte bVar1;
  uint32_t i;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 *__dest;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint64_t buf [25];
  ulong local_5a8 [4];
  ulong local_588;
  ulong local_580;
  ulong local_578;
  ulong local_570;
  ulong local_568;
  ulong local_560;
  ulong local_558;
  ulong local_550;
  ulong local_548;
  ulong local_540;
  ulong local_538;
  ulong local_530;
  ulong local_528;
  ulong local_520;
  ulong local_518;
  ulong local_510;
  ulong local_508;
  ulong local_500;
  ulong local_4f8;
  ulong local_4f0;
  ulong local_4e8;
  uint8_t *local_4d8;
  uint local_4cc;
  ulong local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  ulong local_498;
  ulong local_490;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  ulong local_460;
  ulong local_458;
  ulong local_450;
  ulong local_448;
  long local_440;
  undefined1 local_438 [200];
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined1 local_338 [200];
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined1 local_238 [200];
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined1 local_138 [264];
  
  __src = (state->block_state).snd;
  puVar14 = state->buf;
  uVar4 = state->total_len;
  local_4d8 = output;
  uVar2 = block_len(a);
  uVar3 = block_len(a);
  uVar6 = (ulong)uVar3;
  if ((uVar4 == 0) || (uVar4 % (ulong)uVar2 != 0)) {
    uVar6 = uVar4 % uVar6;
  }
  memset(local_5a8,0,200);
  memcpy(local_5a8,__src,200);
  uVar9 = (uint)a;
  uVar2 = block_len(a);
  uVar3 = block_len(a);
  uVar4 = (ulong)uVar3;
  if (((uint32_t)uVar6 == 0) || ((int)(uVar6 % (ulong)uVar2) != 0)) {
    uVar4 = uVar6 % uVar4;
  }
  block_len(a);
  Hacl_Hash_SHA3_update_multi_sha3(a,local_5a8,puVar14,0);
  Hacl_Hash_SHA3_update_last_sha3(a,local_5a8,puVar14 + (uVar6 - uVar4),(uint32_t)uVar6);
  if ((a & 0xfe) == 0xc) {
    uVar2 = block_len(a);
    if (uVar2 <= l) {
      uVar4 = 0;
      local_4cc = (uint)a;
      do {
        local_350 = 0;
        uStack_348 = 0;
        local_360 = 0;
        uStack_358 = 0;
        local_370 = 0;
        uStack_368 = 0;
        local_340 = 0;
        memcpy(local_438,local_5a8,200);
        memcpy(local_138,local_438,0x100);
        uVar2 = block_len((Spec_Hash_Definitions_hash_alg)uVar9);
        puVar14 = local_4d8 + uVar2 * (int)uVar4;
        local_4c8 = uVar4;
        uVar2 = block_len((Spec_Hash_Definitions_hash_alg)uVar9);
        memcpy(puVar14,local_138,(ulong)uVar2);
        lVar5 = 0;
        do {
          local_440 = lVar5;
          uVar4 = local_580 ^ local_5a8[0];
          uVar21 = local_558 ^ local_530;
          local_460 = local_578;
          local_458 = local_550;
          local_448 = local_528;
          local_4b0 = local_5a8[2];
          local_490 = local_570;
          local_488 = local_548;
          local_480 = local_520;
          local_4a0 = local_568;
          local_478 = local_518;
          local_498 = local_588;
          local_468 = local_560;
          local_470 = local_538;
          local_450 = local_510;
          local_4c0 = local_500;
          uVar6 = local_550 ^ local_528 ^ local_578 ^ local_5a8[1] ^ local_500;
          local_4b8 = local_4f0;
          uVar8 = local_540 ^ local_518 ^ local_568 ^ local_5a8[3] ^ local_4f0;
          local_4a8 = local_4e8;
          uVar16 = local_538 ^ local_510 ^ local_560 ^ local_588 ^ local_4e8;
          uVar10 = (uVar8 << 1 | (ulong)((long)uVar8 < 0)) ^ uVar6;
          uVar6 = (uVar6 << 1 | (ulong)((long)uVar6 < 0)) ^ uVar16;
          local_5a8[0] = local_5a8[0] ^ uVar6;
          local_580 = local_580 ^ uVar6;
          local_558 = local_558 ^ uVar6;
          local_530 = local_530 ^ uVar6;
          uVar21 = uVar21 ^ uVar4 ^ local_508;
          local_508 = uVar6 ^ local_508;
          uVar4 = local_548 ^ local_520 ^ local_570 ^ local_5a8[2] ^ local_4f8;
          uVar6 = (uVar16 << 1 | (ulong)((long)uVar16 < 0)) ^ uVar4;
          uVar4 = (uVar4 << 1 | (ulong)((long)uVar4 < 0)) ^ uVar21;
          local_5a8[1] = local_5a8[1] ^ uVar4;
          local_578 = local_578 ^ uVar4;
          local_550 = local_550 ^ uVar4;
          local_528 = local_528 ^ uVar4;
          local_500 = uVar4 ^ local_500;
          local_5a8[2] = local_5a8[2] ^ uVar10;
          local_570 = local_570 ^ uVar10;
          local_548 = local_548 ^ uVar10;
          local_520 = local_520 ^ uVar10;
          local_4f8 = uVar10 ^ local_4f8;
          local_5a8[3] = local_5a8[3] ^ uVar6;
          local_568 = local_568 ^ uVar6;
          local_540 = local_540 ^ uVar6;
          local_518 = local_518 ^ uVar6;
          local_4f0 = uVar6 ^ local_4f0;
          uVar8 = (uVar21 << 1 | (ulong)((long)uVar21 < 0)) ^ uVar8;
          local_588 = local_588 ^ uVar8;
          local_560 = local_560 ^ uVar8;
          local_538 = local_538 ^ uVar8;
          local_510 = local_510 ^ uVar8;
          local_4e8 = uVar8 ^ local_4e8;
          lVar5 = 0;
          uVar4 = local_5a8[1];
          do {
            uVar6 = local_5a8[Hacl_Hash_SHA3_keccak_piln[lVar5]];
            bVar1 = (byte)Hacl_Hash_SHA3_keccak_rotc[lVar5] & 0x3f;
            local_5a8[Hacl_Hash_SHA3_keccak_piln[lVar5]] = uVar4 << bVar1 | uVar4 >> 0x40 - bVar1;
            uVar9 = local_4cc;
            lVar5 = lVar5 + 1;
            uVar4 = uVar6;
          } while (lVar5 != 0x18);
          uVar15 = ~local_5a8[3] & local_588 ^ local_5a8[2];
          uVar16 = ~local_5a8[2] & local_5a8[3] ^ local_5a8[1];
          local_5a8[3] = ~local_588 & local_5a8[0] ^ local_5a8[3];
          local_588 = ~local_5a8[0] & local_5a8[1] ^ local_588;
          uVar4 = ~local_578 & local_570 ^ local_580;
          uVar17 = ~local_568 & local_560 ^ local_570;
          uVar21 = ~local_570 & local_568 ^ local_578;
          local_568 = ~local_560 & local_580 ^ local_568;
          local_560 = ~local_580 & local_578 ^ local_560;
          uVar6 = ~local_550 & local_548 ^ local_558;
          uVar18 = ~local_540 & local_538 ^ local_548;
          uVar11 = ~local_548 & local_540 ^ local_550;
          local_540 = ~local_538 & local_558 ^ local_540;
          local_538 = ~local_558 & local_550 ^ local_538;
          uVar8 = ~local_528 & local_520 ^ local_530;
          uVar19 = ~local_518 & local_510 ^ local_520;
          uVar12 = ~local_520 & local_518 ^ local_528;
          local_518 = ~local_510 & local_530 ^ local_518;
          local_510 = ~local_530 & local_528 ^ local_510;
          uVar10 = ~local_500 & local_4f8 ^ local_508;
          uVar20 = ~local_4f0 & local_4e8 ^ local_4f8;
          uVar13 = ~local_4f8 & local_4f0 ^ local_500;
          local_4f0 = ~local_4e8 & local_508 ^ local_4f0;
          local_4e8 = ~local_508 & local_500 ^ local_4e8;
          local_5a8[0] = ~local_5a8[1] & local_5a8[2] ^ local_5a8[0] ^
                         Hacl_Hash_SHA3_keccak_rndc[local_440];
          lVar5 = local_440 + 1;
          local_5a8[1] = uVar16;
          local_5a8[2] = uVar15;
          local_580 = uVar4;
          local_578 = uVar21;
          local_570 = uVar17;
          local_558 = uVar6;
          local_550 = uVar11;
          local_548 = uVar18;
          local_530 = uVar8;
          local_528 = uVar12;
          local_520 = uVar19;
          local_508 = uVar10;
          local_500 = uVar13;
          local_4f8 = uVar20;
        } while (lVar5 != 0x18);
        uVar7 = (int)local_4c8 + 1;
        uVar4 = (ulong)uVar7;
        a = (Spec_Hash_Definitions_hash_alg)local_4cc;
        uVar2 = block_len(a);
      } while (uVar7 < l / uVar2);
    }
    uVar2 = block_len(a);
    __dest = local_238;
    local_170 = 0;
    uStack_168 = 0;
    local_160 = 0;
    uStack_158 = 0;
    local_150 = 0;
    uStack_148 = 0;
    local_140 = 0;
    memcpy(__dest,local_5a8,200);
    uVar4 = (ulong)l % (ulong)uVar2;
    puVar14 = local_4d8 + (l - uVar4);
  }
  else {
    hash_len(a);
    block_len(a);
    uVar2 = hash_len(a);
    block_len(a);
    __dest = local_338;
    local_270 = 0;
    uStack_268 = 0;
    local_260 = 0;
    uStack_258 = 0;
    local_250 = 0;
    uStack_248 = 0;
    local_240 = 0;
    memcpy(__dest,local_5a8,200);
    uVar3 = hash_len(a);
    uVar4 = (ulong)uVar2;
    puVar14 = local_4d8 + (uVar3 - uVar4);
  }
  memcpy(puVar14,__dest,uVar4);
  return;
}

Assistant:

static void
digest_(
  Spec_Hash_Definitions_hash_alg a,
  Hacl_Hash_SHA3_state_t *state,
  uint8_t *output,
  uint32_t l
)
{
  Hacl_Hash_SHA3_state_t scrut0 = *state;
  Hacl_Hash_SHA3_hash_buf block_state = scrut0.block_state;
  uint8_t *buf_ = scrut0.buf;
  uint64_t total_len = scrut0.total_len;
  uint32_t r;
  if (total_len % (uint64_t)block_len(a) == 0ULL && total_len > 0ULL)
  {
    r = block_len(a);
  }
  else
  {
    r = (uint32_t)(total_len % (uint64_t)block_len(a));
  }
  uint8_t *buf_1 = buf_;
  uint64_t buf[25U] = { 0U };
  Hacl_Hash_SHA3_hash_buf tmp_block_state = { .fst = a, .snd = buf };
  hash_buf2 scrut = { .fst = block_state, .snd = tmp_block_state };
  uint64_t *s_dst = scrut.snd.snd;
  uint64_t *s_src = scrut.fst.snd;
  memcpy(s_dst, s_src, 25U * sizeof (uint64_t));
  uint32_t ite;
  if (r % block_len(a) == 0U && r > 0U)
  {
    ite = block_len(a);
  }
  else
  {
    ite = r % block_len(a);
  }
  uint8_t *buf_last = buf_1 + r - ite;
  uint8_t *buf_multi = buf_1;
  Spec_Hash_Definitions_hash_alg a1 = tmp_block_state.fst;
  uint64_t *s0 = tmp_block_state.snd;
  Hacl_Hash_SHA3_update_multi_sha3(a1, s0, buf_multi, 0U / block_len(a1));
  Spec_Hash_Definitions_hash_alg a10 = tmp_block_state.fst;
  uint64_t *s1 = tmp_block_state.snd;
  Hacl_Hash_SHA3_update_last_sha3(a10, s1, buf_last, r);
  Spec_Hash_Definitions_hash_alg a11 = tmp_block_state.fst;
  uint64_t *s = tmp_block_state.snd;
  if (a11 == Spec_Hash_Definitions_Shake128 || a11 == Spec_Hash_Definitions_Shake256)
  {
    for (uint32_t i0 = 0U; i0 < l / block_len(a11); i0++)
    {
      uint8_t hbuf[256U] = { 0U };
      uint64_t ws[32U] = { 0U };
      memcpy(ws, s, 25U * sizeof (uint64_t));
      for (uint32_t i = 0U; i < 32U; i++)
      {
        store64_le(hbuf + i * 8U, ws[i]);
      }
      uint8_t *b0 = output;
      uint8_t *uu____0 = hbuf;
      memcpy(b0 + i0 * block_len(a11), uu____0, block_len(a11) * sizeof (uint8_t));
      for (uint32_t i1 = 0U; i1 < 24U; i1++)
      {
        uint64_t _C[5U] = { 0U };
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
        KRML_MAYBE_FOR5(i2,
          0U,
          5U,
          1U,
          uint64_t uu____1 = _C[(i2 + 1U) % 5U];
          uint64_t _D = _C[(i2 + 4U) % 5U] ^ (uu____1 << 1U | uu____1 >> 63U);
          KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i2 + 5U * i] = s[i2 + 5U * i] ^ _D;););
        uint64_t x = s[1U];
        uint64_t current = x;
        for (uint32_t i = 0U; i < 24U; i++)
        {
          uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
          uint32_t r1 = Hacl_Hash_SHA3_keccak_rotc[i];
          uint64_t temp = s[_Y];
          uint64_t uu____2 = current;
          s[_Y] = uu____2 << r1 | uu____2 >> (64U - r1);
          current = temp;
        }
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
          uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
          uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
          uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
          uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
          s[0U + 5U * i] = v0;
          s[1U + 5U * i] = v1;
          s[2U + 5U * i] = v2;
          s[3U + 5U * i] = v3;
          s[4U + 5U * i] = v4;);
        uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i1];
        s[0U] = s[0U] ^ c;
      }
    }
    uint32_t remOut = l % block_len(a11);
    uint8_t hbuf[256U] = { 0U };
    uint64_t ws[32U] = { 0U };
    memcpy(ws, s, 25U * sizeof (uint64_t));
    for (uint32_t i = 0U; i < 32U; i++)
    {
      store64_le(hbuf + i * 8U, ws[i]);
    }
    memcpy(output + l - remOut, hbuf, remOut * sizeof (uint8_t));
    return;
  }
  for (uint32_t i0 = 0U; i0 < hash_len(a11) / block_len(a11); i0++)
  {
    uint8_t hbuf[256U] = { 0U };
    uint64_t ws[32U] = { 0U };
    memcpy(ws, s, 25U * sizeof (uint64_t));
    for (uint32_t i = 0U; i < 32U; i++)
    {
      store64_le(hbuf + i * 8U, ws[i]);
    }
    uint8_t *b0 = output;
    uint8_t *uu____3 = hbuf;
    memcpy(b0 + i0 * block_len(a11), uu____3, block_len(a11) * sizeof (uint8_t));
    for (uint32_t i1 = 0U; i1 < 24U; i1++)
    {
      uint64_t _C[5U] = { 0U };
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
      KRML_MAYBE_FOR5(i2,
        0U,
        5U,
        1U,
        uint64_t uu____4 = _C[(i2 + 1U) % 5U];
        uint64_t _D = _C[(i2 + 4U) % 5U] ^ (uu____4 << 1U | uu____4 >> 63U);
        KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i2 + 5U * i] = s[i2 + 5U * i] ^ _D;););
      uint64_t x = s[1U];
      uint64_t current = x;
      for (uint32_t i = 0U; i < 24U; i++)
      {
        uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
        uint32_t r1 = Hacl_Hash_SHA3_keccak_rotc[i];
        uint64_t temp = s[_Y];
        uint64_t uu____5 = current;
        s[_Y] = uu____5 << r1 | uu____5 >> (64U - r1);
        current = temp;
      }
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
        uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
        uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
        uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
        uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
        s[0U + 5U * i] = v0;
        s[1U + 5U * i] = v1;
        s[2U + 5U * i] = v2;
        s[3U + 5U * i] = v3;
        s[4U + 5U * i] = v4;);
      uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i1];
      s[0U] = s[0U] ^ c;
    }
  }
  uint32_t remOut = hash_len(a11) % block_len(a11);
  uint8_t hbuf[256U] = { 0U };
  uint64_t ws[32U] = { 0U };
  memcpy(ws, s, 25U * sizeof (uint64_t));
  for (uint32_t i = 0U; i < 32U; i++)
  {
    store64_le(hbuf + i * 8U, ws[i]);
  }
  uint8_t *uu____6 = hbuf;
  memcpy(output + hash_len(a11) - remOut, uu____6, remOut * sizeof (uint8_t));
}